

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OStream.h
# Opt level: O0

ostream * Gs::operator<<(ostream *stream,Matrix<float,_10UL,_10UL> *mat)

{
  size_t sVar1;
  long lVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  ostream *poVar6;
  char local_112;
  char local_111;
  char local_da;
  char local_d9;
  allocator local_b1;
  string local_b0 [32];
  ulong local_90;
  size_t c_1;
  size_t r_1;
  ulong local_78;
  size_t r;
  size_t c;
  size_t lengths [10];
  Matrix<float,_10UL,_10UL> *mat_local;
  ostream *stream_local;
  
  lengths[9] = (size_t)mat;
  for (r = 0; r < 10; r = r + 1) {
    lengths[r - 1] = 0;
    for (local_78 = 0; local_78 < 10; local_78 = local_78 + 1) {
      lVar2 = r - 1;
      pfVar3 = Matrix<float,_10UL,_10UL>::operator()
                         ((Matrix<float,_10UL,_10UL> *)lengths[9],local_78,r);
      r_1 = Details::Length<float>(pfVar3);
      puVar4 = std::max<unsigned_long>(lengths + lVar2,&r_1);
      lengths[r - 1] = *puVar4;
    }
  }
  for (c_1 = 0; c_1 < 10; c_1 = c_1 + 1) {
    if (c_1 == 0) {
      local_d9 = '/';
    }
    else {
      local_da = '\\';
      if (c_1 != 9) {
        local_da = '|';
      }
      local_d9 = local_da;
    }
    std::operator<<(stream,local_d9);
    for (local_90 = 0; local_90 < 10; local_90 = local_90 + 1) {
      sVar1 = lengths[local_90 - 1];
      pfVar3 = Matrix<float,_10UL,_10UL>::operator()
                         ((Matrix<float,_10UL,_10UL> *)lengths[9],c_1,local_90);
      sVar5 = Details::Length<float>(pfVar3);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,(sVar1 - sVar5) + 1,' ',&local_b1);
      std::operator<<(stream,local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      pfVar3 = Matrix<float,_10UL,_10UL>::operator()
                         ((Matrix<float,_10UL,_10UL> *)lengths[9],c_1,local_90);
      poVar6 = (ostream *)std::ostream::operator<<(stream,*pfVar3);
      std::operator<<(poVar6,' ');
    }
    if (c_1 == 0) {
      local_111 = '\\';
    }
    else {
      local_112 = '/';
      if (c_1 != 9) {
        local_112 = '|';
      }
      local_111 = local_112;
    }
    poVar6 = std::operator<<(stream,local_111);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  return stream;
}

Assistant:

std::ostream& operator << (std::ostream& stream, const Matrix<T, Rows, Cols>& mat)
{
    /* Determine longest elements for each row */
    std::size_t lengths[Matrix<T, Rows, Cols>::columns];

    for (std::size_t c = 0; c < Matrix<T, Rows, Cols>::columns; ++c)
    {
        lengths[c] = 0;
        for (std::size_t r = 0; r < Matrix<T, Rows, Cols>::rows; ++r)
            lengths[c] = std::max<std::size_t>(lengths[c], Details::Length(mat(r, c)));
    }

    /* Write each row */
    for (std::size_t r = 0; r < Rows; ++r)
    {
        stream << (r == 0 ? '/' : r + 1 == Rows ? '\\' : '|');

        for (std::size_t c = 0; c < Cols; ++c)
        {
            stream << std::string(lengths[c] + 1u - Details::Length(mat(r, c)), ' ');
            stream << mat(r, c) << ' ';
        }

        stream << (r == 0 ? '\\' : r + 1 == Rows ? '/' : '|')  << std::endl;
    }

    return stream;
}